

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O3

int testinator::detail::Arbitrary_Arithmetic<int>::generate
              (size_t generation,unsigned_long randomSeed)

{
  result_type_conflict rVar1;
  TestRegistry *pTVar2;
  long lVar3;
  ulong uVar4;
  uniform_int_distribution<int> dis;
  param_type local_10;
  
  if (generation < 3) {
    return *(int *)(&DAT_00156914 + generation * 4);
  }
  pTVar2 = TestRegistry::Instance();
  uVar4 = randomSeed & 0xffffffff;
  (pTVar2->m_generator)._M_x[0] = uVar4;
  lVar3 = 0x19;
  do {
    uVar4 = (ulong)((((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3) - 0x18);
    *(ulong *)(&(pTVar2->m_tests)._M_t._M_impl.field_0x0 + lVar3 * 8) = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x288);
  (pTVar2->m_generator)._M_p = 0x270;
  local_10._M_a = -0x7fffffff;
  local_10._M_b = 0x7ffffffe;
  rVar1 = ::std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_10,&pTVar2->m_generator,&local_10);
  return rVar1;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<T> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return dis(gen);
          }
        }
      }